

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

writer * argo::operator<<(writer *w,char c)

{
  char s [2];
  allocator local_33;
  char local_32 [2];
  string local_30 [32];
  
  local_32[1] = 0;
  local_32[0] = c;
  std::__cxx11::string::string(local_30,local_32,&local_33);
  (*w->_vptr_writer[2])(w,local_30);
  std::__cxx11::string::~string(local_30);
  return w;
}

Assistant:

writer &NAMESPACE::operator<<(writer& w, char c)
{
    char s[2];
    s[0] = c;
    s[1] = '\0';
    w.write(s);
    return w;
}